

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareFontTables.cpp
# Opt level: O2

void CompareFeatTables(int *ec,TestCase *ptcase,GrIStream *grstrmB,GrIStream *grstrmT,
                      byte *pNameTblB,byte *pNameTblT)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  allocator local_1f1;
  int *local_1f0;
  TestCase *local_1e8;
  ushort local_1da;
  uint local_1d8;
  int local_1d4;
  int local_1d0;
  uint local_1cc;
  int local_1c8;
  uint local_1c4;
  wstring strB;
  wstring strT;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_1f0 = ec;
  local_1e8 = ptcase;
  local_1d0 = (*grstrmB->_vptr_GrIStream[4])(grstrmB);
  iVar1 = (*grstrmT->_vptr_GrIStream[4])(grstrmT);
  if (iVar1 < 0x20001) {
    uVar2 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
    local_1d8 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
    if ((ushort)uVar2 != (ushort)local_1d8) {
      std::__cxx11::string::string
                ((string *)&local_170,"ERROR: Feat table - number of features",(allocator *)&strB);
      OutputError(local_1f0,local_1e8,&local_170,-1);
      std::__cxx11::string::~string((string *)&local_170);
    }
    (*grstrmB->_vptr_GrIStream[3])(grstrmB);
    (*grstrmT->_vptr_GrIStream[3])(grstrmT);
    (*grstrmB->_vptr_GrIStream[4])(grstrmB);
    (*grstrmT->_vptr_GrIStream[4])(grstrmT);
    local_1c4 = uVar2;
    if ((ushort)local_1d8 < (ushort)uVar2) {
      local_1c4 = local_1d8;
    }
    local_1c4 = local_1c4 & 0xffff;
    local_1d4 = 0;
    local_1cc = uVar2;
    local_1c8 = iVar1;
    for (uVar6 = 0; local_1c4 != uVar6; uVar6 = uVar6 + 1) {
      if (local_1d0 < 0x20000) {
        uVar2 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
        uVar2 = uVar2 & 0xffff;
      }
      else {
        uVar2 = (*grstrmB->_vptr_GrIStream[4])(grstrmB);
      }
      if (iVar1 == 0x20000) {
        uVar3 = (*grstrmT->_vptr_GrIStream[4])();
      }
      else {
        uVar3 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
        uVar3 = uVar3 & 0xffff;
      }
      if (uVar2 != uVar3) {
        std::__cxx11::string::string
                  ((string *)&local_50,"ERROR: Feat table - feature ID",(allocator *)&strB);
        OutputError(local_1f0,local_1e8,&local_50,uVar6);
        std::__cxx11::string::~string((string *)&local_50);
      }
      iVar4 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
      iVar5 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
      local_1da = (ushort)iVar4;
      if (local_1da != (ushort)iVar5) {
        std::__cxx11::string::string
                  ((string *)&local_130,"ERROR: Feat table - feature",(allocator *)&strB);
        std::__cxx11::string::string((string *)&local_70,", number of settings",(allocator *)&strT);
        OutputError(local_1f0,local_1e8,&local_130,uVar6,&local_70,-1);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_130);
      }
      if (0x1ffff < local_1d0) {
        (*grstrmB->_vptr_GrIStream[2])(grstrmB);
      }
      if (iVar1 == 0x20000) {
        (*grstrmT->_vptr_GrIStream[2])(grstrmT);
      }
      (*grstrmB->_vptr_GrIStream[4])(grstrmB);
      (*grstrmT->_vptr_GrIStream[4])(grstrmT);
      iVar1 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
      iVar4 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
      if ((short)iVar1 != (short)iVar4) {
        std::__cxx11::string::string
                  ((string *)&local_90,"ERROR: Feat table - feature",(allocator *)&strB);
        std::__cxx11::string::string((string *)&local_b0,", flags",(allocator *)&strT);
        OutputError(local_1f0,local_1e8,&local_90,uVar6,&local_b0,-1);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_90);
      }
      iVar1 = (*grstrmB->_vptr_GrIStream[2])(grstrmB);
      iVar4 = (*grstrmT->_vptr_GrIStream[2])(grstrmT);
      StringFromNameTable_abi_cxx11_(&strB,pNameTblB,0x409,(int)(short)iVar1);
      StringFromNameTable_abi_cxx11_(&strT,pNameTblT,0x409,(int)(short)iVar4);
      iVar4 = wcscmp(strB._M_dataplus._M_p,strT._M_dataplus._M_p);
      iVar1 = local_1c8;
      if (iVar4 != 0) {
        std::__cxx11::string::string
                  ((string *)&local_d0,"ERROR: Feat table - label for feature",&local_1f1);
        OutputError(local_1f0,local_1e8,&local_d0,uVar6);
        std::__cxx11::string::~string((string *)&local_d0);
      }
      local_1d4 = local_1d4 + (uint)local_1da;
      std::__cxx11::wstring::~wstring((wstring *)&strT);
      std::__cxx11::wstring::~wstring((wstring *)&strB);
    }
    if ((short)local_1cc == (short)local_1d8) {
      for (iVar1 = 0; local_1d4 != iVar1; iVar1 = iVar1 + 1) {
        iVar4 = (*grstrmB->_vptr_GrIStream[2])(grstrmB);
        iVar5 = (*grstrmT->_vptr_GrIStream[2])(grstrmT);
        if ((short)iVar4 != (short)iVar5) {
          std::__cxx11::string::string
                    ((string *)&local_f0,"ERROR: Feat table - value for setting",(allocator *)&strB)
          ;
          OutputError(local_1f0,local_1e8,&local_f0,iVar1);
          std::__cxx11::string::~string((string *)&local_f0);
        }
        uVar2 = (*grstrmB->_vptr_GrIStream[3])(grstrmB);
        uVar6 = (*grstrmT->_vptr_GrIStream[3])(grstrmT);
        StringFromNameTable_abi_cxx11_(&strB,pNameTblB,0x409,uVar2 & 0xffff);
        StringFromNameTable_abi_cxx11_(&strT,pNameTblT,0x409,uVar6 & 0xffff);
        iVar4 = wcscmp(strB._M_dataplus._M_p,strT._M_dataplus._M_p);
        if (iVar4 != 0) {
          std::__cxx11::string::string
                    ((string *)&local_110,"ERROR: Feat table - label for setting",&local_1f1);
          OutputError(local_1f0,local_1e8,&local_110,iVar1);
          std::__cxx11::string::~string((string *)&local_110);
        }
        std::__cxx11::wstring::~wstring((wstring *)&strT);
        std::__cxx11::wstring::~wstring((wstring *)&strB);
      }
    }
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_150,"ERROR: Feat table - unknown version number",(allocator *)&strB)
    ;
    OutputError(local_1f0,local_1e8,&local_150,-1);
    std::__cxx11::string::~string((string *)&local_150);
  }
  return;
}

Assistant:

void CompareFeatTables(int & ec, TestCase * ptcase, GrIStream & grstrmB, GrIStream & grstrmT,
	const gr::byte * pNameTblB, const gr::byte * pNameTblT)
{
	int fxdVersionB = ReadVersion(grstrmB);
	int fxdVersionT = ReadVersion(grstrmT);
    Assert(fxdVersionB <= kFeatVersion);
	if (fxdVersionT > kFeatVersion)
	{
		OutputError(ec, ptcase, "ERROR: Feat table - unknown version number");
		return;
	}
	
	//	number of features
	int cfeatB = grstrmB.ReadUShortFromFont();
	int cfeatT = grstrmT.ReadUShortFromFont();
	Assert(cfeatB <= kMaxFeatures);
	if (cfeatB != cfeatT)
		OutputError(ec, ptcase, "ERROR: Feat table - number of features");

	//	reserved
	grstrmB.ReadUShortFromFont();
	grstrmT.ReadUShortFromFont();
	grstrmB.ReadIntFromFont();
	grstrmT.ReadIntFromFont();
	
	int cfset = 0;
	int ifeat;
	for (ifeat = 0; ifeat < min(cfeatB, cfeatT); ifeat++)
	{
		//	ID
		featid nIdB, nIdT;
		if (fxdVersionB >= 0x00020000)
			nIdB = (unsigned int)grstrmB.ReadIntFromFont();
		else
			nIdB = grstrmB.ReadUShortFromFont();
		if (fxdVersionT >= 0x00020000)
			nIdT = (unsigned int)grstrmT.ReadIntFromFont();
		else
			nIdT = grstrmT.ReadUShortFromFont();
		if (nIdB != nIdT)
			OutputError(ec, ptcase, "ERROR: Feat table - feature ID", ifeat);

		//	number of settings
		data16 cfsetThis = grstrmB.ReadUShortFromFont();
		if (cfsetThis != grstrmT.ReadUShortFromFont())
			OutputError(ec, ptcase, "ERROR: Feat table - feature", ifeat, ", number of settings");
		cfset += cfsetThis;

		if (fxdVersionB >= 0x00020000)
			grstrmB.ReadShortFromFont(); // pad bytes
		if (fxdVersionT >= 0x00020000)
			grstrmT.ReadShortFromFont();

		//	offset to settings list
		grstrmB.ReadIntFromFont();
		grstrmT.ReadIntFromFont();

		//	flags
		if (grstrmB.ReadUShortFromFont() != grstrmT.ReadUShortFromFont())
			OutputError(ec, ptcase, "ERROR: Feat table - feature", ifeat, ", flags");

		//	index into name table of UI label
		unsigned int nStrOffsetB = grstrmB.ReadShortFromFont();
		unsigned int nStrOffsetT = grstrmT.ReadShortFromFont();
		std::wstring strB = StringFromNameTable(pNameTblB, 1033, nStrOffsetB);
		std::wstring strT = StringFromNameTable(pNameTblT, 1033, nStrOffsetT);
		if (wcscmp(strB.c_str(), strT.c_str()) != 0)
			OutputError(ec, ptcase, "ERROR: Feat table - label for feature", ifeat);
	}

	if (cfeatB != cfeatT)
		return;

	// setttings
	for (int ifset = 0; ifset < cfset; ifset++)
	{
		if (grstrmB.ReadShortFromFont() != grstrmT.ReadShortFromFont())
			OutputError(ec, ptcase, "ERROR: Feat table - value for setting", ifset);

		// name table offsets
		unsigned int nStrOffsetB = grstrmB.ReadUShortFromFont();
		unsigned int nStrOffsetT = grstrmT.ReadUShortFromFont();
		std::wstring strB = StringFromNameTable(pNameTblB, 1033, nStrOffsetB);
		std::wstring strT = StringFromNameTable(pNameTblT, 1033, nStrOffsetT);
		if (wcscmp(strB.c_str(), strT.c_str()) != 0)
			OutputError(ec, ptcase, "ERROR: Feat table - label for setting", ifset);
	}
}